

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_pubkey_comparison(void)

{
  int iVar1;
  int ecount;
  secp256k1_pubkey pk2;
  secp256k1_pubkey pk1;
  uchar pk2_ser [33];
  uchar pk1_ser [33];
  int *in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff20;
  int iVar2;
  undefined1 local_98 [24];
  secp256k1_pubkey *in_stack_ffffffffffffff80;
  secp256k1_pubkey *in_stack_ffffffffffffff88;
  secp256k1_context *in_stack_ffffffffffffff90;
  secp256k1_context *in_stack_ffffffffffffff98;
  undefined1 local_58 [48];
  undefined1 local_28 [40];
  
  memcpy(local_28,&DAT_0017ffd0,0x21);
  memcpy(local_58,&DAT_00180000,0x21);
  iVar2 = 0;
  set_counting_callbacks
            ((secp256k1_context *)(ulong)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  iVar1 = secp256k1_ec_pubkey_parse
                    (in_stack_ffffffffffffff98,(secp256k1_pubkey *)in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88->data,(size_t)in_stack_ffffffffffffff80);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x262,
            "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pk1, pk1_ser, sizeof(pk1_ser)) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_parse
                    (in_stack_ffffffffffffff98,(secp256k1_pubkey *)in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88->data,(size_t)in_stack_ffffffffffffff80);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x263,
            "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pk2, pk2_ser, sizeof(pk2_ser)) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (-1 < iVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x265,"test condition failed: secp256k1_pubkey_cmp(CTX, NULL, &pk2) < 0");
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x266,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x267,"test condition failed: secp256k1_pubkey_cmp(CTX, &pk1, NULL) > 0");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x268,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (-1 < iVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x269,"test condition failed: secp256k1_pubkey_cmp(CTX, &pk1, &pk2) < 0");
    abort();
  }
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x26a,"test condition failed: secp256k1_pubkey_cmp(CTX, &pk2, &pk1) > 0");
    abort();
  }
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x26b,"test condition failed: secp256k1_pubkey_cmp(CTX, &pk1, &pk1) == 0");
    abort();
  }
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x26c,"test condition failed: secp256k1_pubkey_cmp(CTX, &pk2, &pk2) == 0");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x26d,"test condition failed: ecount == 2");
    abort();
  }
  memset(local_98,0,0x40);
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (-1 < iVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x26f,"test condition failed: secp256k1_pubkey_cmp(CTX, &pk1, &pk2) < 0");
    abort();
  }
  if (iVar2 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x270,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x271,"test condition failed: secp256k1_pubkey_cmp(CTX, &pk1, &pk1) == 0");
    abort();
  }
  if (iVar2 != 5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x272,"test condition failed: ecount == 5");
    abort();
  }
  iVar1 = secp256k1_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x273,"test condition failed: secp256k1_pubkey_cmp(CTX, &pk2, &pk1) > 0");
    abort();
  }
  if (iVar2 != 6) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x274,"test condition failed: ecount == 6");
    abort();
  }
  return;
}

Assistant:

static void test_pubkey_comparison(void) {
    unsigned char pk1_ser[33] = {
        0x02,
        0x58, 0x84, 0xb3, 0xa2, 0x4b, 0x97, 0x37, 0x88, 0x92, 0x38, 0xa6, 0x26, 0x62, 0x52, 0x35, 0x11,
        0xd0, 0x9a, 0xa1, 0x1b, 0x80, 0x0b, 0x5e, 0x93, 0x80, 0x26, 0x11, 0xef, 0x67, 0x4b, 0xd9, 0x23
    };
    const unsigned char pk2_ser[33] = {
        0x03,
        0xde, 0x36, 0x0e, 0x87, 0x59, 0x8f, 0x3c, 0x01, 0x36, 0x2a, 0x2a, 0xb8, 0xc6, 0xf4, 0x5e, 0x4d,
        0xb2, 0xc2, 0xd5, 0x03, 0xa7, 0xf9, 0xf1, 0x4f, 0xa8, 0xfa, 0x95, 0xa8, 0xe9, 0x69, 0x76, 0x1c
    };
    secp256k1_pubkey pk1;
    secp256k1_pubkey pk2;
    int ecount = 0;

    set_counting_callbacks(CTX, &ecount);

    CHECK(secp256k1_ec_pubkey_parse(CTX, &pk1, pk1_ser, sizeof(pk1_ser)) == 1);
    CHECK(secp256k1_ec_pubkey_parse(CTX, &pk2, pk2_ser, sizeof(pk2_ser)) == 1);

    CHECK(secp256k1_pubkey_cmp(CTX, NULL, &pk2) < 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_pubkey_cmp(CTX, &pk1, NULL) > 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_pubkey_cmp(CTX, &pk1, &pk2) < 0);
    CHECK(secp256k1_pubkey_cmp(CTX, &pk2, &pk1) > 0);
    CHECK(secp256k1_pubkey_cmp(CTX, &pk1, &pk1) == 0);
    CHECK(secp256k1_pubkey_cmp(CTX, &pk2, &pk2) == 0);
    CHECK(ecount == 2);
    memset(&pk1, 0, sizeof(pk1)); /* illegal pubkey */
    CHECK(secp256k1_pubkey_cmp(CTX, &pk1, &pk2) < 0);
    CHECK(ecount == 3);
    CHECK(secp256k1_pubkey_cmp(CTX, &pk1, &pk1) == 0);
    CHECK(ecount == 5);
    CHECK(secp256k1_pubkey_cmp(CTX, &pk2, &pk1) > 0);
    CHECK(ecount == 6);

}